

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_bid(archive_read *a,int best_bid)

{
  long *plVar1;
  void *h;
  size_t in_stack_ffffffffffffffd8;
  archive_read *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  plVar1 = (long *)__archive_read_ahead
                             (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                              (ssize_t *)0x13f290);
  if (plVar1 == (long *)0x0) {
    local_4 = -1;
  }
  else if (*plVar1 == 0xa3e686372613c21) {
    local_4 = 0x40;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_ar_bid(struct archive_read *a, int best_bid)
{
	const void *h;

	(void)best_bid; /* UNUSED */

	/*
	 * Verify the 8-byte file signature.
	 * TODO: Do we need to check more than this?
	 */
	if ((h = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);
	if (memcmp(h, "!<arch>\n", 8) == 0) {
		return (64);
	}
	return (-1);
}